

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implicit_weak_message.h
# Opt level: O2

uint8_t * __thiscall
google::protobuf::internal::ImplicitWeakMessage::_InternalSerialize
          (ImplicitWeakMessage *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  string *psVar1;
  uint8_t *puVar2;
  
  psVar1 = this->data_;
  if (psVar1 != (string *)0x0) {
    puVar2 = io::EpsCopyOutputStream::WriteRaw
                       (stream,(psVar1->_M_dataplus)._M_p,(int)psVar1->_M_string_length,target);
    return puVar2;
  }
  return target;
}

Assistant:

uint8_t* _InternalSerialize(
      uint8_t* target, io::EpsCopyOutputStream* stream) const PROTOBUF_FINAL {
    if (data_ == nullptr) {
      return target;
    }
    return stream->WriteRaw(data_->data(), static_cast<int>(data_->size()),
                            target);
  }